

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TeamCityOutputTest_PrintTestIgnored_TestShell::createTest
          (TEST_TeamCityOutputTest_PrintTestIgnored_TestShell *this)

{
  TEST_TeamCityOutputTest_PrintTestIgnored_Test *this_00;
  TEST_TeamCityOutputTest_PrintTestIgnored_TestShell *this_local;
  
  this_00 = (TEST_TeamCityOutputTest_PrintTestIgnored_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x78);
  TEST_TeamCityOutputTest_PrintTestIgnored_Test::TEST_TeamCityOutputTest_PrintTestIgnored_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TeamCityOutputTest, PrintTestIgnored)
{
    const char* expected =
        "##teamcity[testStarted name='test']\n"
        "##teamcity[testIgnored name='test']\n"
        "##teamcity[testFinished name='test' duration='41']\n";

    IgnoredUtestShell* itst = new IgnoredUtestShell("group", "test", "file", 10);
    result->currentTestStarted(itst);
    millisTime = 41;
    result->currentTestEnded(itst);
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
    delete itst;
}